

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

_Bool is_src_var_for_4x4_sub_blocks_caching_enabled(AV1_COMP *cpi)

{
  SPEED_FEATURES *sf;
  AV1_COMP *cpi_local;
  _Bool local_1;
  
  if ((cpi->oxcf).mode == '\x02') {
    if ((cpi->sf).part_sf.partition_search_type == '\0') {
      local_1 = true;
    }
    else if (((double)(cpi->oxcf).speed * -0.25 + 1.0 <= 0.0) ||
            (((cpi->sf).rt_sf.use_nonrd_pick_mode != 0 &&
             ((cpi->sf).rt_sf.hybrid_intra_pickmode == 0)))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool is_src_var_for_4x4_sub_blocks_caching_enabled(
    const AV1_COMP *const cpi) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  if (cpi->oxcf.mode != ALLINTRA) return false;

  if (sf->part_sf.partition_search_type == SEARCH_PARTITION) return true;

  if (INTRA_RD_VAR_THRESH(cpi->oxcf.speed) <= 0 ||
      (sf->rt_sf.use_nonrd_pick_mode && !sf->rt_sf.hybrid_intra_pickmode))
    return false;

  return true;
}